

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snippet.cpp
# Opt level: O1

void __thiscall cpptrace::detail::snippet_manager::build_line_table(snippet_manager *this)

{
  vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_> *this_00;
  pointer *pplVar1;
  iterator iVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  line_range local_48;
  
  this_00 = &this->line_table;
  local_48.begin = 0;
  local_48.end = 0;
  iVar2._M_current =
       (this->line_table).
       super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->line_table).
      super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
    _M_realloc_insert<cpptrace::detail::line_range>(this_00,iVar2,&local_48);
  }
  else {
    (iVar2._M_current)->begin = 0;
    (iVar2._M_current)->end = 0;
    pplVar1 = &(this->line_table).
               super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pplVar1 = *pplVar1 + 1;
  }
  sVar5 = 0;
  do {
    sVar4 = std::__cxx11::string::find((char)&this->contents,10);
    local_48.end = sVar4;
    local_48.begin = sVar5;
    if (sVar4 == 0) {
LAB_00136b7f:
      iVar2._M_current =
           (this->line_table).
           super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->line_table).
          super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
        _M_realloc_insert<cpptrace::detail::line_range>(this_00,iVar2,&local_48);
      }
      else {
        (iVar2._M_current)->begin = sVar5;
        (iVar2._M_current)->end = local_48.end;
        pplVar1 = &(this->line_table).
                   super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
      sVar5 = sVar4 + 1;
      bVar3 = true;
    }
    else {
      if (sVar4 != 0xffffffffffffffff) {
        local_48.end = sVar4 - 1;
        if ((this->contents)._M_dataplus._M_p[sVar4 - 1] != '\r') {
          local_48.end = sVar4;
        }
        goto LAB_00136b7f;
      }
      local_48.end = (this->contents)._M_string_length;
      iVar2._M_current =
           (this->line_table).
           super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->line_table).
          super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
        _M_realloc_insert<cpptrace::detail::line_range>(this_00,iVar2,&local_48);
      }
      else {
        (iVar2._M_current)->begin = sVar5;
        (iVar2._M_current)->end = local_48.end;
        pplVar1 = &(this->line_table).
                   super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
      bVar3 = false;
    }
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void build_line_table() {
            line_table.push_back({0, 0});
            std::size_t pos = 0; // stores the start of the current line
            while(true) {
                // find the end of the current line
                std::size_t terminator_pos = contents.find('\n', pos);
                if(terminator_pos == std::string::npos) {
                    line_table.push_back({pos, contents.size()});
                    break;
                } else {
                    std::size_t end_pos = terminator_pos; // one past the end of the current line
                    if(end_pos > 0 && contents[end_pos - 1] == '\r') {
                        end_pos--;
                    }
                    line_table.push_back({pos, end_pos});
                    pos = terminator_pos + 1;
                }
            }
        }